

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O2

void __thiscall FCycler::Serialize(FCycler *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  pFVar1 = FArchive::operator<<(arc,&this->m_start);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_end);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_current);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_time);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_cycle);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_increment);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_shouldCycle);
  ::operator<<(pFVar1,&this->m_cycleType);
  return;
}

Assistant:

void FCycler::Serialize(FArchive & arc)
{
	arc << m_start << m_end << m_current 
		<< m_time << m_cycle << m_increment << m_shouldCycle
		<< m_cycleType;
}